

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O2

void process_firmware_event(uevent *uevent)

{
  int iVar1;
  int __fd;
  int __fd_00;
  int iVar2;
  size_t __n;
  ssize_t sVar3;
  char *fmt;
  __off_t _Var4;
  char *root;
  char *file;
  char *data;
  char *loading;
  stat st;
  undefined1 local_1038 [4104];
  
  log_write(6,"<6>init: firmware event { \'%s\', \'%s\' }\n",uevent->path,uevent->firmware);
  iVar1 = asprintf(&root,"/sys%s/",uevent->path);
  if (iVar1 != -1) {
    iVar1 = asprintf(&loading,"%sloading",root);
    if (iVar1 != -1) {
      iVar1 = asprintf(&data,"%sdata",root);
      if (iVar1 != -1) {
        iVar1 = asprintf(&file,"/etc/firmware/%s",uevent->firmware);
        if (iVar1 != -1) {
          iVar1 = open(loading,1);
          if (-1 < iVar1) {
            __fd = open(data,1);
            if (-1 < __fd) {
              __fd_00 = open(file,0);
              if (-1 < __fd_00) {
                iVar2 = fstat(__fd_00,(stat *)&st);
                if (iVar2 < 0) {
LAB_00107fc2:
                  fmt = "<6>init: firmware copy failure { \'%s\', \'%s\' }\n";
                }
                else {
                  write(iVar1,"1",1);
                  _Var4 = st.st_size;
                  while (0 < _Var4) {
                    __n = read(__fd_00,local_1038,0x1000);
                    if (__n == 0) break;
                    if ((long)__n < 0) {
LAB_00107fb1:
                      write(iVar1,"-1",2);
                      goto LAB_00107fc2;
                    }
                    _Var4 = _Var4 - __n;
                    while (0 < (long)__n) {
                      sVar3 = write(__fd,local_1038,__n);
                      __n = __n - sVar3;
                      if (sVar3 < 1) goto LAB_00107fb1;
                    }
                  }
                  write(iVar1,"0",1);
                  fmt = "<6>init: firmware copy success { \'%s\', \'%s\' }\n";
                }
                log_write(6,fmt,root,file);
                close(__fd_00);
              }
              close(__fd);
            }
            close(iVar1);
          }
          free(file);
        }
        free(data);
      }
      free(loading);
    }
    free(root);
  }
  return;
}

Assistant:

static void process_firmware_event(struct uevent *uevent)
{
    char *root, *loading, *data, *file;
    int l, loading_fd, data_fd, fw_fd;

    log_event_print("firmware event { '%s', '%s' }\n",
                    uevent->path, uevent->firmware);

    l = asprintf(&root, SYSFS_PREFIX"%s/", uevent->path);
    if (l == -1)
        return;

    l = asprintf(&loading, "%sloading", root);
    if (l == -1)
        goto root_free_out;

    l = asprintf(&data, "%sdata", root);
    if (l == -1)
        goto loading_free_out;

    l = asprintf(&file, FIRMWARE_DIR"/%s", uevent->firmware);
    if (l == -1)
        goto data_free_out;

    loading_fd = open(loading, O_WRONLY);
    if(loading_fd < 0)
        goto file_free_out;

    data_fd = open(data, O_WRONLY);
    if(data_fd < 0)
        goto loading_close_out;

    fw_fd = open(file, O_RDONLY);
    if(fw_fd < 0)
        goto data_close_out;

    if(!load_firmware(fw_fd, loading_fd, data_fd))
        log_event_print("firmware copy success { '%s', '%s' }\n", root, file);
    else
        log_event_print("firmware copy failure { '%s', '%s' }\n", root, file);

    close(fw_fd);
data_close_out:
    close(data_fd);
loading_close_out:
    close(loading_fd);
file_free_out:
    free(file);
data_free_out:
    free(data);
loading_free_out:
    free(loading);
root_free_out:
    free(root);
}